

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ValuesInIteratorRangeGenerator<(anonymous_namespace)::CcsTestCase>::Iterator::
Iterator(Iterator *this,Iterator *other)

{
  Iterator *other_local;
  Iterator *this_local;
  
  memset(this,0,8);
  ParamIteratorInterface<(anonymous_namespace)::CcsTestCase>::ParamIteratorInterface
            (&this->super_ParamIteratorInterface<(anonymous_namespace)::CcsTestCase>);
  (this->super_ParamIteratorInterface<(anonymous_namespace)::CcsTestCase>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_00264778;
  this->base_ = other->base_;
  (this->iterator_)._M_current = (other->iterator_)._M_current;
  std::
  unique_ptr<(anonymous_namespace)::CcsTestCase_const,std::default_delete<(anonymous_namespace)::CcsTestCase_const>>
  ::unique_ptr<std::default_delete<(anonymous_namespace)::CcsTestCase_const>,void>
            ((unique_ptr<(anonymous_namespace)::CcsTestCase_const,std::default_delete<(anonymous_namespace)::CcsTestCase_const>>
              *)&this->value_);
  return;
}

Assistant:

Iterator(const Iterator& other)
          // The explicit constructor call suppresses a false warning
          // emitted by gcc when supplied with the -Wextra option.
        : ParamIteratorInterface<T>(),
          base_(other.base_),
          iterator_(other.iterator_) {}